

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# background_scroller.c
# Opt level: O2

void draw_background(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar1 = al_get_bitmap_width(tile);
  iVar2 = al_get_bitmap_height(tile);
  for (iVar3 = offx; 0 < iVar3; iVar3 = iVar3 - iVar1) {
    offx = iVar3 - iVar1;
  }
  for (iVar3 = offy; 0 < iVar3; iVar3 = iVar3 - iVar2) {
    offy = iVar3 - iVar2;
  }
  for (; iVar3 < screen_height; iVar3 = iVar3 + iVar2) {
    for (iVar4 = offx; iVar4 < screen_width; iVar4 = iVar4 + iVar1) {
      al_draw_bitmap((float)iVar4,(float)iVar3,tile,0);
    }
  }
  return;
}

Assistant:

void draw_background(void)
{
   int dx = al_get_bitmap_width(tile);
   int dy = al_get_bitmap_height(tile);
   int x, y;

   while (offx > 0)
      offx -= dx;
   while (offy > 0)
      offy -= dy;

   for (y = offy; y < screen_height; y += dy) {
      for (x = offx; x < screen_width; x += dx) {
         al_draw_bitmap(tile, x, y, 0);
      }
   }
}